

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::BasicMatrixOperationsBaseVS::Run(BasicMatrixOperationsBaseVS *this)

{
  pointer *ppfVar1;
  allocator<float> *this_00;
  float fVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference pvVar7;
  ulong local_f8;
  size_t i;
  undefined1 local_e8 [6];
  bool status;
  vector<float,_std::allocator<float>_> out_data;
  undefined1 local_c8 [8];
  vector<float,_std::allocator<float>_> zero;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  char *local_50;
  char *glsl_vs;
  vector<float,_std::allocator<float>_> expected;
  vector<float,_std::allocator<float>_> in;
  BasicMatrixOperationsBaseVS *this_local;
  
  bVar3 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,2)
  ;
  if (bVar3) {
    ppfVar1 = &expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)ppfVar1);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&glsl_vs);
    iVar4 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])(this,ppfVar1,(vector<float,_std::allocator<float>_> *)&glsl_vs);
    local_50 = (char *)CONCAT44(extraout_var,iVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,(char *)CONCAT44(extraout_var,iVar4),&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"",
               (allocator<char> *)
               ((long)&zero.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    GVar5 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_80,&local_a8);
    this->m_program = GVar5;
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&zero.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar3) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,2,this->m_buffer);
      sVar6 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)&glsl_vs);
      this_00 = (allocator<float> *)
                ((long)&out_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<float>::allocator(this_00);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_c8,sVar6,this_00);
      std::allocator<float>::~allocator
                ((allocator<float> *)
                 ((long)&out_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,1,this->m_buffer[1]);
      sVar6 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)&glsl_vs);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_c8,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,sVar6 << 2,pvVar7,0x88e4);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_c8);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_buffer[0]);
      ppfVar1 = &expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      sVar6 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)ppfVar1);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)ppfVar1,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,sVar6 << 2,pvVar7,0x88e4);
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glEnable
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c89);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,1);
      sVar6 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)&glsl_vs);
      std::allocator<float>::allocator((allocator<float> *)((long)&i + 7));
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_e8,sVar6,
                 (allocator<float> *)((long)&i + 7));
      std::allocator<float>::~allocator((allocator<float> *)((long)&i + 7));
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_buffer[1]);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      sVar6 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)local_e8);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_e8,0);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,sVar6 << 2,pvVar7);
      i._6_1_ = 1;
      local_f8 = 0;
      while( true ) {
        sVar6 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)local_e8);
        if (sVar6 <= local_f8) break;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&glsl_vs,local_f8);
        fVar2 = *pvVar7;
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)local_e8,local_f8);
        bVar3 = Equal(fVar2,*pvVar7);
        if (!bVar3) {
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)local_e8,local_f8);
          fVar2 = *pvVar7;
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)&glsl_vs,local_f8);
          anon_unknown_0::Output
                    ("Float at index %3d is %f should be %f.\n",(double)fVar2,(double)*pvVar7,
                     local_f8 & 0xffffffff);
          i._6_1_ = 0;
        }
        local_f8 = local_f8 + 1;
      }
      if ((i._6_1_ & 1) == 0) {
        this_local = (BasicMatrixOperationsBaseVS *)&DAT_ffffffffffffffff;
      }
      else {
        this_local = (BasicMatrixOperationsBaseVS *)0x0;
      }
      zero.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_e8);
    }
    else {
      this_local = (BasicMatrixOperationsBaseVS *)&DAT_ffffffffffffffff;
      zero.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&glsl_vs);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &expected.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_local = (BasicMatrixOperationsBaseVS *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;
		std::vector<float> in;
		std::vector<float> expected;
		const char*		   glsl_vs = GetInput(in, expected);

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_buffer);

		/* output buffer */
		{
			std::vector<float> zero(expected.size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(expected.size() * sizeof(float)), &zero[0],
						 GL_STATIC_DRAW);
		}
		// input buffer
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(in.size() * sizeof(float)), &in[0], GL_STATIC_DRAW);

		glGenVertexArrays(1, &m_vertex_array);
		glEnable(GL_RASTERIZER_DISCARD);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);

		std::vector<float> out_data(expected.size());
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[1]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(out_data.size() * sizeof(float)), &out_data[0]);

		bool status = true;
		for (size_t i = 0; i < out_data.size(); ++i)
		{
			if (!Equal(expected[i], out_data[i]))
			{
				Output("Float at index %3d is %f should be %f.\n", static_cast<int>(i), out_data[i], expected[i]);
				status = false;
			}
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}